

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O0

string * print_current_time_abi_cxx11_(void)

{
  tm *ptVar1;
  ostream *poVar2;
  tm *ptVar3;
  string *in_RDI;
  tm broken_down_time;
  time_t current_time;
  string *function;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  LogSeverity in_stack_ffffffffffffff64;
  allocator local_71;
  string local_70 [36];
  Logger local_4c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  time_t local_10 [2];
  
  function = in_RDI;
  local_10[0] = time((time_t *)0x0);
  ptVar1 = localtime_r(local_10,(tm *)&stack0xffffffffffffffb8);
  if (ptVar1 != (tm *)&stack0xffffffffffffffb8) {
    Logger::Logger(&local_4c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
               ,&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,"print_current_time",
               (allocator *)&stack0xffffffffffffff57);
    poVar2 = Logger::Start(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff54,function);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3a);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,
                             "localtime_r(&current_time, &broken_down_time) == &broken_down_time");
    poVar2 = std::operator<<(poVar2," = ");
    ptVar1 = (tm *)&stack0xffffffffffffffb8;
    ptVar3 = localtime_r(local_10,ptVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,ptVar3 == ptVar1);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    Logger::~Logger((Logger *)ptVar1);
    abort();
  }
  StringPrintf_abi_cxx11_
            ((char *)in_RDI,"%04d%02d%02d-%02d%02d%02d",(ulong)(local_34 + 0x76c),
             (ulong)(local_38 + 1),(ulong)local_3c,(ulong)local_40,in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  return function;
}

Assistant:

std::string print_current_time() {
  time_t current_time = time(NULL);
  struct tm broken_down_time;
#ifndef _MSC_VER
  CHECK(localtime_r(&current_time, &broken_down_time) == &broken_down_time);
#else
  CHECK(localtime_s(&broken_down_time, &current_time) == 0);
#endif
  return StringPrintf("%04d%02d%02d-%02d%02d%02d",
                      1900 + broken_down_time.tm_year,
                      1 + broken_down_time.tm_mon,
                      broken_down_time.tm_mday,
                      broken_down_time.tm_hour,
                      broken_down_time.tm_min,
                      broken_down_time.tm_sec);
}